

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backend_sdl.cpp
# Opt level: O1

void __thiscall
CCommandProcessorFragment_OpenGL::Cmd_Texture_Create
          (CCommandProcessorFragment_OpenGL *this,CTextureCreateCommand *pCommand)

{
  uint uVar1;
  uchar *puVar2;
  int iVar3;
  ulong uVar4;
  int *piVar5;
  int iVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  uchar *source;
  uint uVar9;
  uint size;
  uchar *dest;
  undefined8 uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  uchar *pData;
  long lVar17;
  float fVar18;
  ulong local_a0;
  uchar *local_90;
  
  uVar1 = pCommand->m_Width;
  uVar12 = pCommand->m_Height;
  uVar15 = (ulong)uVar12;
  pData = (uchar *)pCommand->m_pData;
  if (pCommand->m_Format - 1U < 2) {
    iVar14 = this->m_MaxTexSize;
    uVar11 = pCommand->m_Flags;
    iVar16 = iVar14;
    if (((((uVar11 & 8) != 0) && (0x3f < this->m_Max3DTexSize)) &&
        (iVar6 = this->m_Max3DTexSize * 0x10, iVar16 = iVar6, (uVar11 & 0x10) != 0)) &&
       (iVar16 = iVar14, iVar6 <= iVar14)) {
      iVar16 = iVar6;
    }
    uVar9 = uVar1;
    if (iVar16 < (int)uVar12 || iVar16 < (int)uVar1) {
      do {
        uVar9 = (int)uVar9 >> 1;
        uVar11 = (int)uVar15 >> 1;
        uVar15 = (ulong)uVar11;
      } while (iVar16 < (int)uVar11 || iVar16 < (int)uVar9);
    }
    else {
      if ((char)((uVar11 & 4) >> 2) != '\0' || ((int)uVar12 < 0x11 || (int)uVar1 < 0x11))
      goto LAB_0011ce16;
      uVar9 = uVar1 >> 1;
      uVar15 = (ulong)(uVar12 >> 1);
    }
    puVar2 = (uchar *)Rescale(uVar1,uVar12,uVar9,(int)uVar15,pCommand->m_Format,pData);
    mem_free(pData);
    pData = puVar2;
    uVar1 = uVar9;
  }
LAB_0011ce16:
  uVar12 = (uint)uVar15;
  if ((pCommand->m_Format == 2) && (0 < (int)(uVar1 * uVar12))) {
    uVar4 = 0;
    do {
      fVar18 = (float)pData[uVar4 * 4 + 3] / 255.0;
      pData[uVar4 * 4] = (uchar)(int)((float)pData[uVar4 * 4] * fVar18);
      pData[uVar4 * 4 + 1] = (uchar)(int)((float)pData[uVar4 * 4 + 1] * fVar18);
      pData[uVar4 * 4 + 2] = (uchar)(int)((float)pData[uVar4 * 4 + 2] * fVar18);
      uVar4 = uVar4 + 1;
    } while (uVar1 * uVar12 != uVar4);
  }
  iVar14 = pCommand->m_Format;
  iVar16 = pCommand->m_Slot;
  this->m_aTextures[iVar16].m_Format = iVar14;
  uVar11 = iVar14 - 1;
  iVar14 = 0x1908;
  uVar7 = 0x1908;
  if (uVar11 < 3) {
    uVar7 = *(undefined4 *)(&DAT_001d6098 + (ulong)uVar11 * 4);
  }
  uVar11 = pCommand->m_StoreFormat - 1;
  if (uVar11 < 3) {
    iVar14 = *(int *)(&DAT_001d6098 + (ulong)uVar11 * 4);
  }
  uVar11 = pCommand->m_Flags;
  if ((uVar11 & 2) != 0) {
    iVar14 = *(int *)((long)iVar14 * 4 + 0x1cfc8c);
  }
  if ((uVar11 & 0x10) != 0) {
    glGenTextures(1,this->m_aTextures + iVar16);
    iVar16 = pCommand->m_Slot;
    piVar5 = &this->m_aTextures[iVar16].m_State;
    *piVar5 = *piVar5 | 1;
    glBindTexture(0xde1,this->m_aTextures[iVar16].m_Tex2D);
    glTexParameteri(0xde1,0x2800,0x2601);
    if ((uVar11 & 1) == 0) {
      glTexParameteri(0xde1,0x2801,(uint)((pCommand->m_Flags & 0x20) == 0) << 8 | 0x2601);
      uVar10 = 0x8191;
      uVar8 = 1;
    }
    else {
      uVar10 = 0x2801;
      uVar8 = 0x2601;
    }
    glTexParameteri(0xde1,uVar10,uVar8);
    glTexImage2D(0xde1,0,iVar14,uVar1,uVar15,0,uVar7,0x1401,pData);
    iVar16 = pCommand->m_PixelSize;
    iVar6 = pCommand->m_Slot;
    this->m_aTextures[iVar6].m_MemSize = uVar1 * uVar12 * iVar16;
    if (((uVar11 & 1) == 0) && (2 < (int)uVar12 && 2 < (int)uVar1)) {
      piVar5 = &this->m_aTextures[iVar6].m_MemSize;
      iVar6 = *piVar5;
      uVar11 = uVar1;
      do {
        iVar6 = (int)(uVar15 >> 1) * iVar16 * (uVar11 >> 1) + iVar6;
        if (uVar11 < 6) break;
        uVar9 = (uint)uVar15;
        uVar15 = uVar15 >> 1;
        uVar11 = uVar11 >> 1;
      } while (5 < uVar9);
      *piVar5 = iVar6;
    }
  }
  puVar2 = pData;
  if (((pCommand->m_Flags & 8) != 0) && (iVar16 = this->m_Max3DTexSize, 0x3f < iVar16)) {
    uVar11 = uVar1 + 0xf;
    if (-1 < (int)uVar1) {
      uVar11 = uVar1;
    }
    iVar6 = (int)uVar11 >> 4;
    uVar1 = uVar12 + 0xf;
    if (-1 < (int)uVar12) {
      uVar1 = uVar12;
    }
    uVar11 = (int)uVar1 >> 4;
    iVar13 = iVar6 * uVar11;
    uVar9 = pCommand->m_PixelSize * iVar13 * 0x100;
    puVar2 = (uchar *)mem_alloc(uVar9);
    iVar3 = pCommand->m_PixelSize;
    size = iVar3 * iVar6;
    mem_zero(puVar2,uVar9);
    local_a0 = 0;
    lVar17 = 0;
    local_90 = puVar2;
    do {
      if (0xf < (int)uVar12) {
        source = pData + (int)(pCommand->m_PixelSize * iVar6 *
                              (((uint)local_a0 & 0xf) + (int)(local_a0 >> 4) * (uVar1 & 0xfffffff0))
                              );
        dest = local_90;
        uVar15 = (ulong)uVar11;
        do {
          mem_copy(dest,source,size);
          source = source + (int)(size * 0x10);
          dest = dest + (int)size;
          uVar15 = uVar15 - 1;
        } while (uVar15 != 0);
      }
      lVar17 = lVar17 + 1;
      local_a0 = (ulong)((uint)local_a0 + 1);
      local_90 = local_90 + iVar3 * iVar13;
    } while (lVar17 != 0x100);
    iVar3 = 0x100;
    if (iVar16 < 0x100) {
      iVar3 = iVar16;
    }
    mem_free(pData);
    glGenTextures(this->m_TextureArraySize,this->m_aTextures[pCommand->m_Slot].m_Tex3D);
    piVar5 = &this->m_aTextures[pCommand->m_Slot].m_State;
    *piVar5 = *piVar5 | 2;
    if (0 < this->m_TextureArraySize) {
      iVar16 = 0;
      lVar17 = 0;
      do {
        glBindTexture(0x806f,this->m_aTextures[pCommand->m_Slot].m_Tex3D[lVar17]);
        glTexParameteri(0x806f,0x2800,0x2601);
        glTexParameteri(0x806f,0x2801,0x2601);
        glTexImage3D(0x806f,0,iVar14,iVar6,(ulong)uVar11,iVar3,0,uVar7,0x1401,
                     puVar2 + pCommand->m_PixelSize * iVar16);
        piVar5 = &this->m_aTextures[pCommand->m_Slot].m_MemSize;
        *piVar5 = *piVar5 + pCommand->m_PixelSize * iVar13;
        lVar17 = lVar17 + 1;
        iVar16 = iVar16 + uVar11 * iVar6 * iVar3;
      } while (lVar17 < this->m_TextureArraySize);
    }
  }
  *this->m_pTextureMemoryUsage =
       *this->m_pTextureMemoryUsage + this->m_aTextures[pCommand->m_Slot].m_MemSize;
  mem_free(puVar2);
  return;
}

Assistant:

void CCommandProcessorFragment_OpenGL::Cmd_Texture_Create(const CCommandBuffer::CTextureCreateCommand *pCommand)
{
	int Width = pCommand->m_Width;
	int Height = pCommand->m_Height;
	void *pTexData = pCommand->m_pData;

	// resample if needed
	if(pCommand->m_Format == CCommandBuffer::TEXFORMAT_RGBA || pCommand->m_Format == CCommandBuffer::TEXFORMAT_RGB)
	{
		int MaxTexSize = m_MaxTexSize;
		if((pCommand->m_Flags&CCommandBuffer::TEXFLAG_TEXTURE3D) && m_Max3DTexSize >= CTexture::MIN_GL_MAX_3D_TEXTURE_SIZE)
		{
			if(pCommand->m_Flags&CCommandBuffer::TEXFLAG_TEXTURE2D)
				MaxTexSize = minimum(MaxTexSize, m_Max3DTexSize * IGraphics::NUMTILES_DIMENSION);
			else
				MaxTexSize = m_Max3DTexSize * IGraphics::NUMTILES_DIMENSION;
		}
		if(Width > MaxTexSize || Height > MaxTexSize)
		{
			do
			{
				Width>>=1;
				Height>>=1;
			}
			while(Width > MaxTexSize || Height > MaxTexSize);

			void *pTmpData = Rescale(pCommand->m_Width, pCommand->m_Height, Width, Height, pCommand->m_Format, static_cast<const unsigned char *>(pCommand->m_pData));
			mem_free(pTexData);
			pTexData = pTmpData;
		}
		else if(Width > IGraphics::NUMTILES_DIMENSION && Height > IGraphics::NUMTILES_DIMENSION && (pCommand->m_Flags&CCommandBuffer::TEXFLAG_QUALITY) == 0)
		{
			Width>>=1;
			Height>>=1;

			void *pTmpData = Rescale(pCommand->m_Width, pCommand->m_Height, Width, Height, pCommand->m_Format, static_cast<const unsigned char *>(pCommand->m_pData));
			mem_free(pTexData);
			pTexData = pTmpData;
		}
	}

	// use premultiplied alpha for rgba textures
	if(pCommand->m_Format == CCommandBuffer::TEXFORMAT_RGBA)
	{
		unsigned char *pTexels = (unsigned char *)pTexData;
		for(int i = 0; i < Width * Height; ++i)
		{
			const float a = (pTexels[i*4+3]/255.0f);
			pTexels[i*4+0] = (unsigned char)(pTexels[i*4+0] * a);
			pTexels[i*4+1] = (unsigned char)(pTexels[i*4+1] * a);
			pTexels[i*4+2] = (unsigned char)(pTexels[i*4+2] * a);
		}
	}
	m_aTextures[pCommand->m_Slot].m_Format = pCommand->m_Format;

	//
	int Oglformat = TexFormatToOpenGLFormat(pCommand->m_Format);
	int StoreOglformat = TexFormatToOpenGLFormat(pCommand->m_StoreFormat);

	if(pCommand->m_Flags&CCommandBuffer::TEXFLAG_COMPRESSED)
	{
		switch(StoreOglformat)
		{
			case GL_RGB: StoreOglformat = GL_COMPRESSED_RGB_ARB; break;
			case GL_ALPHA: StoreOglformat = GL_COMPRESSED_ALPHA_ARB; break;
			case GL_RGBA: StoreOglformat = GL_COMPRESSED_RGBA_ARB; break;
			default: StoreOglformat = GL_COMPRESSED_RGBA_ARB;
		}
	}

	// 2D texture
	if(pCommand->m_Flags&CCommandBuffer::TEXFLAG_TEXTURE2D)
	{
		bool Mipmaps = !(pCommand->m_Flags&CCommandBuffer::TEXFLAG_NOMIPMAPS);
		glGenTextures(1, &m_aTextures[pCommand->m_Slot].m_Tex2D);
		m_aTextures[pCommand->m_Slot].m_State |= CTexture::STATE_TEX2D;
		glBindTexture(GL_TEXTURE_2D, m_aTextures[pCommand->m_Slot].m_Tex2D);
		if(!Mipmaps)
		{
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
			glTexImage2D(GL_TEXTURE_2D, 0, StoreOglformat, Width, Height, 0, Oglformat, GL_UNSIGNED_BYTE, pTexData);
		}
		else
		{
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
			if(pCommand->m_Flags&CCommandBuffer::TEXTFLAG_LINEARMIPMAPS)
				glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
			else
				glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR_MIPMAP_NEAREST);
			glTexParameteri(GL_TEXTURE_2D, GL_GENERATE_MIPMAP, GL_TRUE);
			glTexImage2D(GL_TEXTURE_2D, 0, StoreOglformat, Width, Height, 0, Oglformat, GL_UNSIGNED_BYTE, pTexData);
		}

		// calculate memory usage
		m_aTextures[pCommand->m_Slot].m_MemSize = Width*Height*pCommand->m_PixelSize;
		if(Mipmaps)
		{
			int TexWidth = Width;
			int TexHeight = Height;
			while(TexWidth > 2 && TexHeight > 2)
			{
				TexWidth>>=1;
				TexHeight>>=1;
				m_aTextures[pCommand->m_Slot].m_MemSize += TexWidth*TexHeight*pCommand->m_PixelSize;
			}
		}
	}

	// 3D texture
	if((pCommand->m_Flags&CCommandBuffer::TEXFLAG_TEXTURE3D) && m_Max3DTexSize >= CTexture::MIN_GL_MAX_3D_TEXTURE_SIZE)
	{
		Width /= IGraphics::NUMTILES_DIMENSION;
		Height /= IGraphics::NUMTILES_DIMENSION;
		int Depth = minimum(m_Max3DTexSize, IGraphics::NUMTILES_DIMENSION * IGraphics::NUMTILES_DIMENSION);

		// copy and reorder texture data
		int MemSize = Width*Height*IGraphics::NUMTILES_DIMENSION*IGraphics::NUMTILES_DIMENSION*pCommand->m_PixelSize;
		char *pTmpData = (char *)mem_alloc(MemSize);

		const int TileSize = (Height * Width) * pCommand->m_PixelSize;
		const int TileRowSize = Width * pCommand->m_PixelSize;
		const int ImagePitch = Width * IGraphics::NUMTILES_DIMENSION * pCommand->m_PixelSize;
		mem_zero(pTmpData, MemSize);
		for(int i = 0; i < IGraphics::NUMTILES_DIMENSION * IGraphics::NUMTILES_DIMENSION; i++)
		{
			const int px = (i%IGraphics::NUMTILES_DIMENSION) * Width;
			const int py = (i/IGraphics::NUMTILES_DIMENSION) * Height;
			const char *pTileData = (const char *)pTexData + (py * Width * IGraphics::NUMTILES_DIMENSION + px) * pCommand->m_PixelSize;
			for(int y = 0; y < Height; y++)
				mem_copy(pTmpData + i*TileSize + y*TileRowSize, pTileData + y * ImagePitch, TileRowSize);
		}

		mem_free(pTexData);

		//
		glGenTextures(m_TextureArraySize, m_aTextures[pCommand->m_Slot].m_Tex3D);
		m_aTextures[pCommand->m_Slot].m_State |= CTexture::STATE_TEX3D;
		for(int i = 0; i < m_TextureArraySize; ++i)
		{
			glBindTexture(GL_TEXTURE_3D, m_aTextures[pCommand->m_Slot].m_Tex3D[i]);
			glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
			glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
			pTexData = pTmpData+i*(Width*Height*Depth*pCommand->m_PixelSize);
			glTexImage3D(GL_TEXTURE_3D, 0, StoreOglformat, Width, Height, Depth, 0, Oglformat, GL_UNSIGNED_BYTE, pTexData);

			m_aTextures[pCommand->m_Slot].m_MemSize += Width*Height*pCommand->m_PixelSize;
		}
		pTexData = pTmpData;
	}

	*m_pTextureMemoryUsage += m_aTextures[pCommand->m_Slot].m_MemSize;

	mem_free(pTexData);
}